

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O2

void __thiscall
Glucose::OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted>::cleanAll
          (OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted> *this)

{
  int *piVar1;
  long lVar2;
  int i;
  long lVar3;
  
  lVar2 = 0;
  for (lVar3 = 0; piVar1 = (this->dirties).data, lVar3 < (this->dirties).sz; lVar3 = lVar3 + 1) {
    if ((this->dirty).data[*(int *)((long)piVar1 + lVar2)] != '\0') {
      clean(this,(int *)((long)piVar1 + lVar2));
    }
    lVar2 = lVar2 + 4;
  }
  if (piVar1 != (int *)0x0) {
    (this->dirties).sz = 0;
  }
  return;
}

Assistant:

void OccLists<Idx,Vec,Deleted>::cleanAll()
{
    for (int i = 0; i < dirties.size(); i++)
        // Dirties may contain duplicates so check here if a variable is already cleaned:
        if (dirty[toInt(dirties[i])])
            clean(dirties[i]);
    dirties.clear();
}